

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O2

bool __thiscall bloaty::dwarf::LocationList::NextEntry(LocationList *this)

{
  string_view *data;
  unsigned_short uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  
  data = &this->remaining_;
  uVar2 = CompilationUnitSizes::ReadAddress(&this->sizes_,data);
  uVar3 = CompilationUnitSizes::ReadAddress(&this->sizes_,data);
  if (((uVar3 != 0 || uVar2 != 0) && (uVar2 != 0xffffffffffffffff)) &&
     ((uVar2 != 0xffffffff || ((this->sizes_).addr8_ == true)))) {
    uVar1 = ReadFixed<unsigned_short,2ul>(data);
    ReadBytes((ulong)uVar1,data);
  }
  return uVar3 != 0 || uVar2 != 0;
}

Assistant:

bool LocationList::NextEntry() {
  uint64_t start, end;
  start = sizes_.ReadAddress(&remaining_);
  end = sizes_.ReadAddress(&remaining_);
  if (start == 0 && end == 0) {
    return false;
  } else if (start == UINT64_MAX ||
             (start == UINT32_MAX && sizes_.address_size() == 4)) {
    // Base address selection, nothing more to do.
  } else {
    // Need to skip the location description.
    uint16_t length = ReadFixed<uint16_t>(&remaining_);
    SkipBytes(length, &remaining_);
  }
  return true;
}